

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  byte bVar1;
  cJSON_bool cVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  cJSON *pcVar9;
  size_t sVar10;
  long lVar11;
  double dVar12;
  uchar number_buffer [26];
  double local_60;
  char local_58 [32];
  double local_38;
  undefined8 uStack_30;
  
  cVar2 = 0;
  if (output_buffer == (printbuffer *)0x0 || item == (cJSON *)0x0) {
    return 0;
  }
  bVar1 = (byte)item->type;
  if (bVar1 < 0x10) {
    switch(bVar1) {
    case 1:
      puVar5 = ensure(output_buffer,6);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      builtin_memcpy(puVar5,"false",6);
      break;
    case 2:
      puVar5 = ensure(output_buffer,5);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      builtin_memcpy(puVar5,"true",5);
      break;
    default:
      goto switchD_0010b43c_caseD_3;
    case 4:
      puVar5 = ensure(output_buffer,5);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      builtin_memcpy(puVar5,"null",5);
      break;
    case 8:
      dVar12 = item->valuedouble;
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0x18] = '\0';
      local_58[0x19] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_60 = 0.0;
      if ((ulong)ABS(dVar12) < 0x7ff0000000000000) {
        if ((dVar12 != (double)item->valueint) || (NAN(dVar12) || NAN((double)item->valueint))) {
          uStack_30 = 0;
          local_38 = dVar12;
          uVar3 = sprintf(local_58,"%1.15g");
          iVar4 = __isoc99_sscanf(local_58,"%lg",&local_60);
          if (iVar4 == 1) {
            dVar12 = ABS(local_60);
            if (ABS(local_60) <= ABS(local_38)) {
              dVar12 = ABS(local_38);
            }
            if (ABS(local_60 - local_38) <= dVar12 * 2.220446049250313e-16) goto LAB_0010b8aa;
          }
          uVar3 = sprintf(local_58,"%1.17g");
        }
        else {
          uVar3 = sprintf(local_58,"%d");
        }
LAB_0010b8aa:
        if (uVar3 < 0x1a) goto LAB_0010b8af;
      }
      else {
        builtin_strncpy(local_58,"null",5);
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        uVar3 = 4;
LAB_0010b8af:
        uVar8 = (ulong)uVar3;
        puVar5 = ensure(output_buffer,uVar8 + 1);
        if (puVar5 != (uchar *)0x0) {
          if (uVar8 != 0) {
            memcpy(puVar5,local_58,uVar8);
          }
          puVar5[uVar8] = '\0';
          output_buffer->offset = output_buffer->offset + uVar8;
          break;
        }
      }
LAB_0010b8e6:
      cVar2 = 0;
      goto switchD_0010b43c_caseD_3;
    }
  }
  else {
    if (bVar1 < 0x40) {
      if (bVar1 == 0x10) {
        cVar2 = print_string_ptr((uchar *)item->valuestring,output_buffer);
        return cVar2;
      }
      if (bVar1 != 0x20) {
        return 0;
      }
      pcVar9 = item->child;
      puVar5 = ensure(output_buffer,1);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      *puVar5 = '[';
      output_buffer->offset = output_buffer->offset + 1;
      output_buffer->depth = output_buffer->depth + 1;
      for (; pcVar9 != (cJSON *)0x0; pcVar9 = pcVar9->next) {
        cVar2 = print_value(pcVar9,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar10 = output_buffer->offset;
          sVar6 = strlen((char *)(output_buffer->buffer + sVar10));
          output_buffer->offset = sVar6 + sVar10;
        }
        if (pcVar9->next == (cJSON *)0x0) break;
        uVar8 = (ulong)(output_buffer->format == 0);
        puVar5 = ensure(output_buffer,uVar8 ^ 3);
        if (puVar5 == (uchar *)0x0) {
          return 0;
        }
        *puVar5 = ',';
        if (output_buffer->format == 0) {
          puVar5 = puVar5 + 1;
        }
        else {
          puVar5[1] = ' ';
          puVar5 = puVar5 + 2;
        }
        *puVar5 = '\0';
        output_buffer->offset = output_buffer->offset + (2 - uVar8);
      }
      puVar5 = ensure(output_buffer,2);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      puVar5[0] = ']';
      puVar5[1] = '\0';
    }
    else {
      if (bVar1 != 0x40) {
        if (bVar1 != 0x80) {
          return 0;
        }
        if (item->valuestring == (char *)0x0) {
          return 0;
        }
        sVar6 = strlen(item->valuestring);
        puVar5 = ensure(output_buffer,sVar6 + 1);
        if (puVar5 == (uchar *)0x0) {
          return 0;
        }
        memcpy(puVar5,item->valuestring,sVar6 + 1);
        goto LAB_0010b92f;
      }
      pcVar9 = item->child;
      uVar8 = (ulong)(output_buffer->format == 0);
      puVar5 = ensure(output_buffer,uVar8 ^ 3);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      *puVar5 = '{';
      output_buffer->depth = output_buffer->depth + 1;
      if (output_buffer->format != 0) {
        puVar5[1] = '\n';
      }
      output_buffer->offset = output_buffer->offset + (2 - uVar8);
      for (; pcVar9 != (cJSON *)0x0; pcVar9 = pcVar9->next) {
        if (output_buffer->format != 0) {
          puVar5 = ensure(output_buffer,output_buffer->depth);
          if (puVar5 == (uchar *)0x0) goto LAB_0010b8e6;
          if (output_buffer->depth == 0) {
            uVar8 = 0;
          }
          else {
            uVar7 = 0;
            do {
              puVar5[uVar7] = '\t';
              uVar7 = uVar7 + 1;
              uVar8 = output_buffer->depth;
            } while (uVar7 < uVar8);
          }
          output_buffer->offset = output_buffer->offset + uVar8;
        }
        cVar2 = print_string_ptr((uchar *)pcVar9->string,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar10 = output_buffer->offset;
          sVar6 = strlen((char *)(output_buffer->buffer + sVar10));
          output_buffer->offset = sVar6 + sVar10;
        }
        sVar10 = 2 - (ulong)(output_buffer->format == 0);
        puVar5 = ensure(output_buffer,sVar10);
        if (puVar5 == (uchar *)0x0) {
          return 0;
        }
        *puVar5 = ':';
        if (output_buffer->format != 0) {
          puVar5[1] = '\t';
        }
        output_buffer->offset = output_buffer->offset + sVar10;
        cVar2 = print_value(pcVar9,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar10 = output_buffer->offset;
          sVar6 = strlen((char *)(output_buffer->buffer + sVar10));
          output_buffer->offset = sVar6 + sVar10;
        }
        lVar11 = ((ulong)(pcVar9->next != (cJSON *)0x0) + 1) - (ulong)(output_buffer->format == 0);
        puVar5 = ensure(output_buffer,lVar11 + 1);
        if (puVar5 == (uchar *)0x0) {
          return 0;
        }
        if (pcVar9->next != (cJSON *)0x0) {
          *puVar5 = ',';
          puVar5 = puVar5 + 1;
        }
        if (output_buffer->format != 0) {
          *puVar5 = '\n';
          puVar5 = puVar5 + 1;
        }
        *puVar5 = '\0';
        output_buffer->offset = output_buffer->offset + lVar11;
      }
      if (output_buffer->format == 0) {
        sVar10 = 2;
      }
      else {
        sVar10 = output_buffer->depth + 1;
      }
      puVar5 = ensure(output_buffer,sVar10);
      if (puVar5 == (uchar *)0x0) {
        return 0;
      }
      if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
        uVar8 = 0;
        do {
          puVar5[uVar8] = '\t';
          uVar8 = uVar8 + 1;
        } while (uVar8 < output_buffer->depth - 1);
        puVar5 = puVar5 + uVar8;
      }
      puVar5[0] = '}';
      puVar5[1] = '\0';
    }
    output_buffer->depth = output_buffer->depth - 1;
  }
LAB_0010b92f:
  cVar2 = 1;
switchD_0010b43c_caseD_3:
  return cVar2;
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}